

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

void __thiscall Js::SourceTextModuleRecord::InitializeIndirectExports(SourceTextModuleRecord *this)

{
  IdentPtr pIVar1;
  IdentPtr pIVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  Type *pTVar8;
  SourceTextModuleRecord *pSVar9;
  JavascriptError *pError;
  ScriptContext *scriptContext;
  PCWSTR specifier;
  HRESULT hr;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *pSVar10;
  Iterator local_48;
  long local_38;
  ModuleNameRecord *exportRecord;
  
  local_38 = 0;
  pSVar10 = (this->indirectExportRecordList).ptr;
  if (pSVar10 != (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    local_48.list =
         &pSVar10->super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>;
    local_48.current = (NodeBase *)pSVar10;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_009e9aae:
    if (pSVar10 == (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
      pSVar10 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                local_48.current;
    }
    local_48.current =
         (pSVar10->super_SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>).
         super_SListNodeBase<Memory::ArenaAllocator>.next;
    if ((SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_48.current
        != local_48.list) {
      pTVar8 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data(&local_48);
      pIVar1 = pTVar8->moduleRequest;
      pIVar2 = pTVar8->exportName;
      uVar5 = EnsurePropertyIdForIdentifier(this,pTVar8->importName);
      specifier = (PCWSTR)&pIVar1->field_0x22;
      pSVar9 = GetChildModuleRecord(this,specifier);
      if (pSVar9 != (SourceTextModuleRecord *)0x0) goto code_r0x009e9b39;
      pError = JavascriptLibrary::CreateReferenceError
                         ((((this->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary);
      scriptContext = (this->scriptContext).ptr;
      hr = -0x7ff5e9f2;
      goto LAB_009e9ba1;
    }
  }
  return;
code_r0x009e9b39:
  pSVar10 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
  if ((uVar5 != 0x70) &&
     ((iVar6 = (*(pSVar9->super_ModuleRecordBase).super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])
                         (pSVar9,(ulong)uVar5,0,&local_38), (char)iVar6 == '\0' ||
      (pSVar10 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
                 local_48.current, local_38 == 0)))) {
    pError = JavascriptLibrary::CreateSyntaxError
                       ((((this->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary);
    specifier = (PCWSTR)&pIVar2->field_0x22;
    scriptContext = (this->scriptContext).ptr;
    hr = -0x7ff5e9f5;
LAB_009e9ba1:
    JavascriptError::SetErrorMessage(pError,hr,specifier,scriptContext);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->errorObject,pError);
    pSVar10 = (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)
              local_48.current;
  }
  goto LAB_009e9aae;
}

Assistant:

void SourceTextModuleRecord::InitializeIndirectExports()
    {
        ModuleNameRecord* exportRecord = nullptr;
        if (indirectExportRecordList != nullptr)
        {
            indirectExportRecordList->Map([&](ModuleImportOrExportEntry exportEntry)
            {
                PropertyId propertyId = EnsurePropertyIdForIdentifier(exportEntry.importName);
                SourceTextModuleRecord* childModuleRecord = GetChildModuleRecord(exportEntry.moduleRequest->Psz());
                if (childModuleRecord == nullptr)
                {
                    JavascriptError* errorObj = scriptContext->GetLibrary()->CreateReferenceError();
                    JavascriptError::SetErrorMessage(errorObj, JSERR_CannotResolveModule, exportEntry.moduleRequest->Psz(), scriptContext);
                    this->errorObject = errorObj;
                    return;
                }
                if (propertyId != PropertyIds::star_ &&
                    (!childModuleRecord->ResolveExport(propertyId, nullptr, &exportRecord) ||
                    (exportRecord == nullptr)))
                {
                    JavascriptError* errorObj = scriptContext->GetLibrary()->CreateSyntaxError();
                    JavascriptError::SetErrorMessage(errorObj, JSERR_ModuleResolveExport, exportEntry.exportName->Psz(), scriptContext);
                    this->errorObject = errorObj;
                    return;
                }
            });
        }
    }